

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDfsReverseNodes(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pNode;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int nNodes_local;
  Abc_Obj_t **ppNodes_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,299,"Vec_Ptr_t *Abc_NtkDfsReverseNodes(Abc_Ntk_t *, Abc_Obj_t **, int)");
  }
  Abc_NtkIncrementTravId(pNtk);
  iVar1 = Abc_AigLevel(pNtk);
  vNodes_00 = Vec_PtrStart(iVar1 + 1);
  local_3c = 0;
  while( true ) {
    if (nNodes <= local_3c) {
      return vNodes_00;
    }
    pAVar2 = ppNodes[local_3c];
    iVar1 = Abc_ObjIsCi(pAVar2);
    if (iVar1 == 0) break;
    Abc_NodeSetTravIdCurrent(pAVar2);
    pAVar2 = Abc_ObjFanout0Ntk(pAVar2);
    for (local_40 = 0; iVar1 = Abc_ObjFanoutNum(pAVar2), local_40 < iVar1; local_40 = local_40 + 1)
    {
      pNode = Abc_ObjFanout(pAVar2,local_40);
      Abc_NtkDfsReverseNodes_rec(pNode,vNodes_00);
    }
    local_3c = local_3c + 1;
  }
  __assert_fail("Abc_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                ,0x133,"Vec_Ptr_t *Abc_NtkDfsReverseNodes(Abc_Ntk_t *, Abc_Obj_t **, int)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverseNodes( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrStart( Abc_AigLevel(pNtk) + 1 );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = ppNodes[i];
        assert( Abc_ObjIsCi(pObj) );
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverseNodes_rec( pFanout, vNodes );
    }
    return vNodes;
}